

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geoplg.cpp
# Opt level: O0

Stream * rw::writeMesh(Stream *stream,int32 param_2,void *object,int32 param_4,int32 param_5)

{
  int local_478;
  int local_474;
  int32 j;
  int32 n;
  int32 numIndices;
  uint16 *ind;
  Mesh *pMStack_458;
  uint32 i;
  Mesh *mesh;
  Geometry *geo;
  int32 indbuf [256];
  uint32 local_3c;
  int32 local_38;
  MeshStream ms;
  MeshHeaderStream mhs;
  int32 param_4_local;
  int32 param_3_local;
  void *object_local;
  int32 param_1_local;
  Stream *stream_local;
  
  ms.numIndices = **(uint32 **)((long)object + 0x90);
  ms.matIndex = (int32)*(ushort *)(*(long *)((long)object + 0x90) + 4);
  Stream::write32(stream,&ms,0xc);
  pMStack_458 = MeshHeader::getMeshes(*(MeshHeader **)((long)object + 0x90));
  for (ind._4_4_ = 0; ind._4_4_ < *(ushort *)(*(long *)((long)object + 0x90) + 4);
      ind._4_4_ = ind._4_4_ + 1) {
    local_3c = pMStack_458->numIndices;
    local_38 = MaterialList::findIndex((MaterialList *)((long)object + 0x80),pMStack_458->material);
    Stream::write32(stream,&local_3c,8);
    if ((*(uint *)((long)object + 0x10) & 0x1000000) == 0) {
      _n = pMStack_458->indices;
      for (j = pMStack_458->numIndices; 0 < j; j = j + -0x100) {
        if (j < 0x100) {
          local_478 = j;
        }
        else {
          local_478 = 0x100;
        }
        for (local_474 = 0; local_474 < local_478; local_474 = local_474 + 1) {
          indbuf[(long)local_474 + -2] = (uint)_n[local_474];
        }
        Stream::write32(stream,&geo,local_478 << 2);
        _n = _n + local_478;
      }
    }
    else if (**(int **)((long)object + 0x98) == 0xb) {
      Stream::write16(stream,pMStack_458->indices,pMStack_458->numIndices << 1);
    }
    pMStack_458 = pMStack_458 + 1;
  }
  return stream;
}

Assistant:

static Stream*
writeMesh(Stream *stream, int32, void *object, int32, int32)
{
	MeshHeaderStream mhs;
	MeshStream ms;
	int32 indbuf[256];
	Geometry *geo = (Geometry*)object;
	mhs.flags = geo->meshHeader->flags;
	mhs.numMeshes = geo->meshHeader->numMeshes;
	mhs.totalIndices = geo->meshHeader->totalIndices;
	stream->write32(&mhs, sizeof(MeshHeaderStream));
	Mesh *mesh = geo->meshHeader->getMeshes();
	for(uint32 i = 0; i < geo->meshHeader->numMeshes; i++){
		ms.numIndices = mesh->numIndices;
		ms.matIndex = geo->matList.findIndex(mesh->material);
		stream->write32(&ms, sizeof(MeshStream));
		if(geo->flags & Geometry::NATIVE){
			assert(geo->instData != nil);
			if(geo->instData->platform == PLATFORM_WDGL)
				stream->write16(mesh->indices,
				            mesh->numIndices*2);
		}else{
			uint16 *ind = mesh->indices;
			int32 numIndices = mesh->numIndices;
			for(; numIndices > 0; numIndices -= 256){
				int32 n = numIndices < 256 ? numIndices : 256;
				for(int32 j = 0; j < n; j++)
					indbuf[j] = ind[j];
				stream->write32(indbuf, n*4);
				ind += n;
			}
		}
		mesh++;
	}
	return stream;
}